

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_reader.cpp
# Opt level: O0

uchar copy_to_mem(FILE *fp,Elf32_Ehdr *elf_hdr,uchar *rom_mem)

{
  code *pcVar1;
  ushort uVar2;
  size_t sVar3;
  void *__ptr;
  bool bVar4;
  int local_68;
  int local_64;
  int j;
  int i;
  char *shstrtab;
  uint uStack_50;
  unsigned_short shstrndx;
  unsigned_short phentsize;
  unsigned_short phnum;
  uint insn;
  uint sectsize;
  uint freemem_addr;
  uint padd;
  elf32_phdr *elf_phdata;
  unsigned_short size_section_header;
  void *pvStack_30;
  unsigned_short num_section_header;
  Elf32_Shdr *elf_shdr_array;
  uchar *rom_mem_local;
  Elf32_Ehdr *elf_hdr_local;
  FILE *fp_local;
  
  _freemem_addr = (void *)0x0;
  sectsize = 0;
  insn = 0;
  _phentsize = 0;
  elf_phdata._6_2_ = elf_hdr->e_shnum << 8 | elf_hdr->e_shnum >> 8;
  elf_phdata._4_2_ = elf_hdr->e_shentsize << 8 | elf_hdr->e_shentsize >> 8;
  elf_shdr_array = (Elf32_Shdr *)rom_mem;
  rom_mem_local = elf_hdr->e_ident;
  elf_hdr_local = (Elf32_Ehdr *)fp;
  fseek((FILE *)fp,
        (ulong)(elf_hdr->e_shoff << 0x18 | (elf_hdr->e_shoff >> 8 & 0xff) << 0x10 |
                (elf_hdr->e_shoff >> 0x10 & 0xff) << 8 | elf_hdr->e_shoff >> 0x18),0);
  pvStack_30 = malloc((long)(int)((uint)elf_phdata._4_2_ * (uint)elf_phdata._6_2_));
  sVar3 = fread(pvStack_30,(long)(int)((uint)elf_phdata._4_2_ * (uint)elf_phdata._6_2_),1,
                (FILE *)elf_hdr_local);
  if (sVar3 == 1) {
    shstrtab._6_2_ = 0;
    if ((((*(uint *)(rom_mem_local + 0x1c) & 0xff) != 0 ||
         (*(uint *)(rom_mem_local + 0x1c) >> 8 & 0xff) != 0) ||
        (*(uint *)(rom_mem_local + 0x1c) >> 0x10 & 0xff) != 0) ||
        *(uint *)(rom_mem_local + 0x1c) >> 0x18 != 0) {
      shstrtab._6_2_ =
           *(short *)(rom_mem_local + 0x2c) << 8 | *(ushort *)(rom_mem_local + 0x2c) >> 8;
      uVar2 = *(short *)(rom_mem_local + 0x2a) << 8 | *(ushort *)(rom_mem_local + 0x2a) >> 8;
      _freemem_addr = malloc((long)(int)((uint)shstrtab._6_2_ * (uint)uVar2));
      fseek((FILE *)elf_hdr_local,
            (ulong)(*(int *)(rom_mem_local + 0x1c) << 0x18 |
                    (*(uint *)(rom_mem_local + 0x1c) >> 8 & 0xff) << 0x10 |
                    (*(uint *)(rom_mem_local + 0x1c) >> 0x10 & 0xff) << 8 |
                   *(uint *)(rom_mem_local + 0x1c) >> 0x18),0);
      sVar3 = fread(_freemem_addr,1,(long)(int)((uint)shstrtab._6_2_ * (uint)uVar2),
                    (FILE *)elf_hdr_local);
      if (sVar3 != (long)(int)((uint)shstrtab._6_2_ * (uint)uVar2)) {
        printf("error!! read elf error\n");
        return '\0';
      }
    }
    uVar2 = *(short *)(rom_mem_local + 0x32) << 8 | *(ushort *)(rom_mem_local + 0x32) >> 8;
    fseek((FILE *)elf_hdr_local,
          (ulong)(*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x10) << 0x18 |
                  (*(uint *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x10) >> 8 & 0xff) << 0x10 |
                  (*(uint *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x10) >> 0x10 & 0xff) << 8 |
                 *(uint *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x10) >> 0x18),0);
    __ptr = malloc((long)(int)(*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) << 0x18 |
                               (*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) >> 8 & 0xffU
                               ) << 0x10 |
                               (*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) >> 0x10 &
                               0xffU) << 8 |
                              *(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) >> 0x18 &
                              0xffU));
    sVar3 = fread(__ptr,(long)(int)(*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) << 0x18
                                    | (*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) >> 8
                                      & 0xffU) << 0x10 |
                                    (*(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) >> 0x10
                                    & 0xffU) << 8 |
                                   *(int *)((long)pvStack_30 + (ulong)uVar2 * 0x28 + 0x14) >> 0x18 &
                                   0xffU),1,(FILE *)elf_hdr_local);
    if (sVar3 == 1) {
      for (local_64 = 0; local_64 < (int)(uint)elf_phdata._6_2_; local_64 = local_64 + 1) {
        if (((*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 4) >> 0x18 & 1U) != 0) &&
           ((*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 8) >> 0x18 & 2U) != 0)) {
          sectsize = *(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0xc) << 0x18 |
                     (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0xc) >> 8 & 0xff) << 0x10
                     | (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0xc) >> 0x10 & 0xff) <<
                       8 | *(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0xc) >> 0x18;
          for (local_68 = 0; local_68 < (int)(uint)shstrtab._6_2_; local_68 = local_68 + 1) {
            if ((((((*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) & 0xff) != 0 ||
                   (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 8 & 0xff) != 0) ||
                  (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x10 & 0xff) != 0)
                  || *(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x18 != 0) &&
                ((*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) << 0x18 |
                  (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 8 & 0xff) << 0x10 |
                  (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x10 & 0xff) << 8 |
                 *(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x18) <=
                 (*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) << 0x18 |
                  (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 8 & 0xff) << 0x10 |
                  (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x10 & 0xff) << 8 |
                 *(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x18))) &&
               ((*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) << 0x18 |
                 (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 8 & 0xff) << 0x10 |
                 (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x10 & 0xff) << 8 |
                *(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x18) <
                (*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) << 0x18 |
                 (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 8 & 0xff) << 0x10 |
                 (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x10 & 0xff) << 8 |
                *(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x18) +
                (*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 0x14) << 0x18 |
                 (*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 0x14) >> 8 & 0xffU) << 0x10
                 | (*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 0x14) >> 0x10 & 0xffU) <<
                   8 | *(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 0x14) >> 0x18 & 0xffU)
               )) {
              sectsize = ((*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 0xc) << 0x18 |
                           (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 0xc) >> 8 & 0xff
                           ) << 0x10 |
                           (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 0xc) >> 0x10 &
                           0xff) << 8 |
                          *(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 0xc) >> 0x18) +
                         (*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) << 0x18 |
                          (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 8 & 0xff)
                          << 0x10 | (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >>
                                     0x10 & 0xff) << 8 |
                         *(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x18)) -
                         (*(int *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) << 0x18 |
                          (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 8 & 0xff)
                          << 0x10 | (*(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >>
                                     0x10 & 0xff) << 8 |
                         *(uint *)((long)_freemem_addr + (long)local_68 * 0x20 + 4) >> 0x18);
            }
          }
          insn = sectsize;
          _phentsize = *(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x14) << 0x18 |
                       (*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x14) >> 8 & 0xffU) <<
                       0x10 | (*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x14) >> 0x10 &
                              0xffU) << 8 |
                       *(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x14) >> 0x18 & 0xffU;
          fseek((FILE *)elf_hdr_local,
                (ulong)(*(int *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) << 0x18 |
                        (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 8 & 0xff) <<
                        0x10 | (*(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x10 &
                               0xff) << 8 |
                       *(uint *)((long)pvStack_30 + (long)local_64 * 0x28 + 0x10) >> 0x18),0);
          while( true ) {
            bVar4 = false;
            if (_phentsize != 0) {
              sVar3 = fread(&stack0xffffffffffffffb0,4,1,(FILE *)elf_hdr_local);
              bVar4 = sVar3 != 0;
            }
            if (!bVar4) break;
            uStack_50 = uStack_50 << 0x18 | (uStack_50 >> 8 & 0xff) << 0x10 |
                        (uStack_50 >> 0x10 & 0xff) << 8 | uStack_50 >> 0x18;
            add_program(insn,uStack_50,(uchar *)elf_shdr_array);
            _phentsize = _phentsize - 4;
            insn = insn + 4;
          }
        }
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    printf("error!! read elf\n");
  }
  else {
    printf("error!! read elf\n");
  }
  return '\0';
}

Assistant:

unsigned char copy_to_mem(FILE *fp, Elf32_Ehdr *elf_hdr, unsigned char *rom_mem)
{
    Elf32_Shdr *elf_shdr_array;
	unsigned short num_section_header = 0;
	unsigned short size_section_header = 0;
    struct elf32_phdr *elf_phdata = NULL;
	unsigned int padd = 0;
	unsigned int freemem_addr = 0;
	unsigned int sectsize = 0;
	unsigned int insn;

    num_section_header = CONVERT_SHORT(elf_hdr->e_shnum);
	size_section_header = CONVERT_SHORT(elf_hdr->e_shentsize);
	fseek(fp, CONVERT_INT(elf_hdr->e_shoff), SEEK_SET);
	elf_shdr_array = (Elf32_Shdr *)malloc(size_section_header*num_section_header);

    if (fread(elf_shdr_array, size_section_header*num_section_header, 1, fp) != 1)
	{
		printf("error!! read elf\n");
		return false;
	}

	unsigned short phnum = 0;
	unsigned short phentsize = 0;
	//load segment
	if(CONVERT_INT(elf_hdr->e_phoff))
	{
		phnum = CONVERT_SHORT(elf_hdr->e_phnum);
		phentsize = CONVERT_SHORT(elf_hdr->e_phentsize);

		elf_phdata = (struct elf32_phdr *)malloc(phnum * phentsize);

		fseek(fp, CONVERT_INT(elf_hdr->e_phoff), SEEK_SET);

		if (fread(elf_phdata, 1, phnum*phentsize, fp) != phnum*phentsize)
		{
			printf("error!! read elf error\n");
			return false;
		}
	}

	//section name table
	unsigned short shstrndx = CONVERT_SHORT(elf_hdr->e_shstrndx);
	fseek(fp, CONVERT_INT(elf_shdr_array[shstrndx].sh_offset), SEEK_SET);
	char * shstrtab = (char *)malloc(CONVERT_INT(elf_shdr_array[shstrndx].sh_size));
	if (fread(shstrtab, CONVERT_INT(elf_shdr_array[shstrndx].sh_size), 1, fp) != 1)
	{
		printf("error!! read elf\n");
		return false;
	}

	for(int i = 0; i<num_section_header; i++)
	{
#ifdef __PRINT_DEBUG__
		unsigned int name_index = CONVERT_INT(elf_shdr_array[i].sh_name);
		printf("name = %s\n", shstrtab + name_index);
#endif
		if( (CONVERT_INT(elf_shdr_array[i].sh_type) & SHT_PROGBITS) && (CONVERT_INT(elf_shdr_array[i].sh_flags) & SHF_ALLOC) )
		{
			//segment covers section
			padd = CONVERT_INT(elf_shdr_array[i].sh_addr);
			for(int j = 0; j<phnum; j++)
			{
				if(CONVERT_INT(elf_phdata[j].p_offset) && 
					(CONVERT_INT(elf_phdata[j].p_offset) <= CONVERT_INT(elf_shdr_array[i].sh_offset)) &&
					((CONVERT_INT(elf_phdata[j].p_offset) + CONVERT_INT(elf_phdata[j].p_memsz)) > CONVERT_INT(elf_shdr_array[i].sh_offset)) )
				padd = CONVERT_INT(elf_phdata[j].p_paddr) + CONVERT_INT(elf_shdr_array[i].sh_offset) - CONVERT_INT(elf_phdata[j].p_offset);
			}

			freemem_addr = padd;
			sectsize = CONVERT_INT(elf_shdr_array[i].sh_size);

			fseek(fp, CONVERT_INT(elf_shdr_array[i].sh_offset), SEEK_SET);

			while(sectsize>0 && fread(&insn, sizeof(insn), 1, fp))
			{
				insn = CONVERT_INT(insn);
				//add program to program mem
				//based on section
				add_program(freemem_addr, insn, rom_mem);
#ifdef __PRINT_DEBUG__
				printf("0x%02x%02x%02x%02x\n", program_mem[freemem+0], program_mem[freemem+1], program_mem[freemem+2], program_mem[freemem+3]);
#endif
				sectsize-=4;
				freemem_addr+=4;
			}

		}
	}
    
}